

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>_>::
     appendTo<QChar>(type *p,QChar **out)

{
  QChar *pQVar1;
  char16_t *pcVar2;
  CutResult CVar3;
  char16_t *pcVar4;
  long lVar5;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (long)(p->a).a.m_length;
  if (lVar5 != 0) {
    pQVar1 = *out;
    pcVar2 = (p->a).a.m_string.d.ptr;
    local_40 = (long)(p->a).a.m_offset;
    local_48 = lVar5;
    CVar3 = QtPrivate::QContainerImplHelper::mid((p->a).a.m_string.d.size,&local_40,&local_48);
    pcVar4 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar4 = pcVar2 + local_40;
    }
    memcpy(pQVar1,pcVar4,lVar5 * 2);
    *out = *out + lVar5;
  }
  lVar5 = (long)(p->a).b.m_length;
  if (lVar5 != 0) {
    pQVar1 = *out;
    pcVar2 = (p->a).b.m_string.d.ptr;
    local_40 = (long)(p->a).b.m_offset;
    local_48 = lVar5;
    CVar3 = QtPrivate::QContainerImplHelper::mid((p->a).b.m_string.d.size,&local_40,&local_48);
    pcVar4 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar4 = pcVar2 + local_40;
    }
    memcpy(pQVar1,pcVar4,lVar5 * 2);
    *out = *out + lVar5;
  }
  lVar5 = (long)(p->b).m_length;
  if (lVar5 != 0) {
    pQVar1 = *out;
    pcVar2 = (p->b).m_string.d.ptr;
    local_40 = (long)(p->b).m_offset;
    local_48 = lVar5;
    CVar3 = QtPrivate::QContainerImplHelper::mid((p->b).m_string.d.size,&local_40,&local_48);
    pcVar4 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar4 = pcVar2 + local_40;
    }
    memcpy(pQVar1,pcVar4,lVar5 * 2);
    *out = *out + lVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }